

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseFor(Scope *scope,Lexer *lexer)

{
  Token TVar1;
  int iVar2;
  ASTNode *pAVar3;
  char *pcVar4;
  ASTNode *pAVar5;
  ASTNode *var;
  Token tok;
  ASTNode *forExpr;
  Lexer *lexer_local;
  Scope *scope_local;
  
  pAVar3 = GetNextNode(scope);
  pAVar3->isStmt = true;
  pAVar3->type = FOR;
  TVar1 = GetNextToken(lexer);
  if (TVar1 != LPAREN) {
    pcVar4 = TokenToString(TVar1);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","LPAREN",pcVar4,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  TVar1 = GetNextToken(lexer);
  pAVar5 = ParseVar(scope,lexer,TVar1);
  (pAVar3->meta).binaryExpr.left = pAVar5;
  pAVar5 = ParseExpression(scope,lexer);
  (pAVar3->meta).binaryExpr.right = pAVar5;
  pAVar5 = ParseExpression(scope,lexer);
  (pAVar3->meta).forExpr.inc = pAVar5;
  TVar1 = GetNextToken(lexer);
  if (TVar1 != RPAREN) {
    pcVar4 = TokenToString(TVar1);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","RPAREN",pcVar4,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  iVar2 = ParseBody(scope,lexer);
  (pAVar3->meta).forExpr.body = iVar2;
  return pAVar3;
}

Assistant:

ASTNode* ParseFor(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("For");
	TRACK();
	ASTNode* forExpr = GetNextNode(scope);
	SET_IS_STMT(forExpr);
	SET_NODE_TYPE(forExpr, FOR);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	tok = GetNextToken(lexer);

	/**
	 * Since this is an internal variable for a for loop,
	 * this will not be a top level statement.
	 */
	ASTNode* var = ParseVar(scope, lexer, tok);

	SET_FOR_VAR(forExpr, var);
	SET_FOR_CONDITION(forExpr, ParseExpression(scope, lexer));
	SET_FOR_INC(forExpr, ParseExpression(scope, lexer));

	tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, RPAREN, lexer);
	SET_FOR_BODY(forExpr, ParseBody(scope, lexer));
	return forExpr;
}